

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_fraction(int64_t nom,uint64_t denom)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  MTBDD MVar4;
  uint64_t value;
  
  if (nom == 0) {
    value = 1;
  }
  else {
    lVar2 = -nom;
    if (0 < nom) {
      lVar2 = nom;
    }
    uVar1 = gcd((uint32_t)lVar2,(uint32_t)denom);
    lVar2 = nom / (long)(ulong)uVar1;
    uVar3 = denom / uVar1;
    if ((lVar2 - 0x80000000U < 0xffffffff00000001) || (uVar3 >> 0x20 != 0)) {
      fwrite("mtbdd_fraction: fraction overflow\n",0x22,1,_stderr);
    }
    value = lVar2 << 0x20 | uVar3;
  }
  MVar4 = mtbdd_makeleaf(2,value);
  return MVar4;
}

Assistant:

MTBDD
mtbdd_fraction(int64_t nom, uint64_t denom)
{
    if (nom == 0) return mtbdd_makeleaf(2, 1);
    uint32_t c = gcd(nom < 0 ? -nom : nom, denom);
    nom /= c;
    denom /= c;
    if (nom > 2147483647 || nom < -2147483647 || denom > 4294967295) fprintf(stderr, "mtbdd_fraction: fraction overflow\n");
    return mtbdd_makeleaf(2, (nom<<32)|denom);
}